

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lights.cpp
# Opt level: O0

float pbrt::cie_y(float lambda)

{
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float t2;
  float t1;
  
  fVar1 = (in_XMM0_Da - 568.8) *
          (float)(~-(uint)(in_XMM0_Da < 568.8) & 0x3cca57a8 |
                 -(uint)(in_XMM0_Da < 568.8) & 0x3cae7d56);
  fVar2 = (in_XMM0_Da - 530.9) *
          (float)(~-(uint)(in_XMM0_Da < 530.9) & 0x3d03e426 |
                 -(uint)(in_XMM0_Da < 530.9) & 0x3d7b15b5);
  dVar3 = std::exp((double)(ulong)(uint)(fVar1 * -0.5 * fVar1));
  dVar4 = std::exp((double)(ulong)(uint)(fVar2 * -0.5 * fVar2));
  return SUB84(dVar3,0) * 0.821 + SUB84(dVar4,0) * 0.286;
}

Assistant:

inline float cie_y(float lambda)
  {
      float t1 = (lambda - 568.8f) * ((lambda < 568.8f) ? 0.0213f : 0.0247f);
      float t2 = (lambda - 530.9f) * ((lambda < 530.9f) ? 0.0613f : 0.0322f);
  
      return 0.821f * std::exp(-0.5f * t1 * t1) + 0.286f * std::exp(-0.5f * t2 * t2);
  }